

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

qulonglong __thiscall QVariant::toULongLong(QVariant *this,bool *ok)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  bool bVar3;
  QMetaType QVar4;
  long in_FS_OFFSET;
  unsigned_long_long ret;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
  if (ok != (bool *)0x0) {
    *ok = true;
  }
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QVar4.d_ptr = (QMetaTypeInterface *)(this->d).data.shared;
  }
  else {
    local_28.d_ptr = (QMetaTypeInterface *)0x0;
    uVar2 = *(ulong *)&(this->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    bVar3 = QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),this,local_20,
                               &local_28);
    QVar4.d_ptr = local_28.d_ptr;
    if (ok != (bool *)0x0) {
      *ok = bVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return (qulonglong)QVar4.d_ptr;
}

Assistant:

qulonglong QVariant::toULongLong(bool *ok) const
{
    return qNumVariantToHelper<qulonglong>(d, ok);
}